

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

void string_handler(void *data,char *s,int len)

{
  long lVar1;
  char *__s;
  size_t __n;
  void *pvVar2;
  size_t sVar3;
  undefined8 uVar4;
  size_t __n_00;
  
  if (*(int *)((long)data + 0x50) < 1) {
    lVar1 = *data;
    __s = *(char **)(lVar1 + 0x10);
    if (__s == (char *)0x0) {
      pvVar2 = malloc((long)(len + 1));
      *(void **)(lVar1 + 0x10) = pvVar2;
      sVar3 = (size_t)len;
      if (pvVar2 == (void *)0x0) {
        sVar3 = sVar3 + 1;
        uVar4 = 0xf06;
        goto LAB_0012d8bf;
      }
      memcpy(pvVar2,s,sVar3);
      *(undefined1 *)((long)pvVar2 + sVar3) = 0;
    }
    else {
      __n = strlen(__s);
      __n_00 = (size_t)len;
      sVar3 = __n + __n_00 + 1;
      pvVar2 = malloc(sVar3);
      if (pvVar2 == (void *)0x0) {
        uVar4 = 0xf16;
LAB_0012d8bf:
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",sVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                       ,uVar4);
        abort_parser((parser_info *)data);
        return;
      }
      memcpy(pvVar2,__s,__n);
      memcpy((void *)((long)pvVar2 + __n),s,__n_00);
      *(undefined1 *)((long)pvVar2 + __n + __n_00) = 0;
      free(__s);
      *(void **)(*data + 0x10) = pvVar2;
    }
  }
  return;
}

Assistant:

static void XMLCALL string_handler(void *data, const char *s, int len)
{
    parser_info *info = (parser_info *)data;

    if (info->unparsed_depth > 0)
    {
        return;
    }

    if (info->node->char_data == NULL)
    {
        info->node->char_data = malloc(len + 1);
        if (info->node->char_data == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)len + 1, __FILE__, __LINE__);
            abort_parser(info);
            return;
        }
        memcpy(info->node->char_data, s, len);
        info->node->char_data[len] = '\0';
    }
    else
    {
        char *char_data;
        long current_length = (long)strlen(info->node->char_data);

        char_data = malloc(current_length + len + 1);
        if (char_data == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           current_length + len + 1, __FILE__, __LINE__);
            abort_parser(info);
            return;
        }
        memcpy(char_data, info->node->char_data, current_length);
        memcpy(&char_data[current_length], s, len);
        char_data[current_length + len] = '\0';
        free(info->node->char_data);
        info->node->char_data = char_data;
    }
}